

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZEqnArray<double>_> * __thiscall
TPZVec<TPZEqnArray<double>_>::operator=
          (TPZVec<TPZEqnArray<double>_> *this,initializer_list<TPZEqnArray<double>_> *list)

{
  size_type sVar1;
  const_iterator pTVar2;
  initializer_list<TPZEqnArray<double>_> *in_RSI;
  TPZEqnArray<double> *in_RDI;
  TPZEqnArray<double> *aux;
  const_iterator it_end;
  const_iterator it;
  TPZEqnArray<double> *in_stack_ffffffffffffffc8;
  const_iterator local_18;
  
  sVar1 = std::initializer_list<TPZEqnArray<double>_>::size(in_RSI);
  (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,sVar1);
  local_18 = std::initializer_list<TPZEqnArray<double>_>::begin(in_RSI);
  pTVar2 = std::initializer_list<TPZEqnArray<double>_>::end
                     ((initializer_list<TPZEqnArray<double>_> *)in_RDI);
  for (; local_18 != pTVar2; local_18 = local_18 + 1) {
    TPZEqnArray<double>::operator=(in_RDI,in_stack_ffffffffffffffc8);
  }
  return (TPZVec<TPZEqnArray<double>_> *)in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}